

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcCore.c
# Opt level: O3

void Bdc_ManDecomposeTest(uint uTruth,int nVars)

{
  uint uVar1;
  Bdc_Man_t *p;
  uint uFunc;
  uint uCare;
  uint local_34 [2];
  Bdc_Par_t local_2c;
  
  local_2c.fVerbose = 0;
  local_2c.fVeryVerbose = 0;
  local_34[1] = 0xffffffff;
  local_2c.nVarsMax = 8;
  local_34[0] = uTruth;
  p = Bdc_ManAlloc(&local_2c);
  uVar1 = Bdc_ManDecompose(p,local_34,local_34 + 1,nVars,(Vec_Ptr_t *)0x0,1000);
  Bdc_ManDecomposeTest::Total = Bdc_ManDecomposeTest::Total + uVar1;
  Bdc_ManDecomposeTest::Counter = Bdc_ManDecomposeTest::Counter + 1;
  printf("%5d : Nodes = %5d. Total = %8d.\n",(ulong)(uint)Bdc_ManDecomposeTest::Counter,(ulong)uVar1
        );
  Bdc_ManFree(p);
  return;
}

Assistant:

void Bdc_ManDecomposeTest( unsigned uTruth, int nVars )
{
    static int Counter = 0;
    static int Total = 0;
    Bdc_Par_t Pars = {0}, * pPars = &Pars;
    Bdc_Man_t * p;
    int RetValue;
//    unsigned uCare = ~0x888f888f;
    unsigned uCare = ~0;
//    unsigned uFunc =  0x88888888;
//    unsigned uFunc =  0xf888f888;
//    unsigned uFunc =  0x117e117e;
//    unsigned uFunc =  0x018b018b;
    unsigned uFunc = uTruth; 

    pPars->nVarsMax = 8;
    p = Bdc_ManAlloc( pPars );
    RetValue = Bdc_ManDecompose( p, &uFunc, &uCare, nVars, NULL, 1000 );
    Total += RetValue;
    printf( "%5d : Nodes = %5d. Total = %8d.\n", ++Counter, RetValue, Total );
//    Bdc_ManDecPrint( p );
    Bdc_ManFree( p );
}